

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepeatedTest.h
# Opt level: O2

void __thiscall CppUnit::RepeatedTest::~RepeatedTest(RepeatedTest *this)

{
  TestDecorator::~TestDecorator(&this->super_TestDecorator);
  operator_delete(this,0x18);
  return;
}

Assistant:

class CPPUNIT_API RepeatedTest : public TestDecorator 
{
public:
  RepeatedTest( Test *test, 
                int timesRepeat ) : 
      TestDecorator( test ), 
      m_timesRepeat(timesRepeat) 
  {
  }

  void run( TestResult *result );

  int countTestCases() const;

private:
  RepeatedTest( const RepeatedTest & );
  void operator=( const RepeatedTest & );

  const int m_timesRepeat;
}